

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngrams_raw.c
# Opt level: O3

void read_dmp_weight_array
               (FILE *fp,logmath_t *lmath,uint8 do_swap,int32 counts,ngram_raw_t *raw_ngrams,
               int weight_idx)

{
  uint uVar1;
  float fVar2;
  void *__ptr;
  long lVar3;
  undefined7 in_register_00000011;
  uint uVar4;
  ulong uVar5;
  uint local_34;
  
  fread(&local_34,4,1,(FILE *)fp);
  uVar4 = local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 |
          local_34 << 0x18;
  if ((int)CONCAT71(in_register_00000011,do_swap) == 0) {
    uVar4 = local_34;
  }
  __ptr = __ckd_calloc__((long)(int)uVar4,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngrams_raw.c"
                         ,0xd3);
  fread(__ptr,4,(long)(int)uVar4,(FILE *)fp);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      if (do_swap == '\0') {
        fVar2 = *(float *)((long)__ptr + uVar5 * 4);
      }
      else {
        uVar1 = *(uint *)((long)__ptr + uVar5 * 4);
        fVar2 = (float)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18);
        *(float *)((long)__ptr + uVar5 * 4) = fVar2;
      }
      fVar2 = logmath_log10_to_log_float(lmath,(float64)(double)fVar2);
      *(float *)((long)__ptr + uVar5 * 4) = fVar2;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  if (0 < counts) {
    lVar3 = 0;
    do {
      if (weight_idx == 0) {
        *(undefined4 *)((long)&raw_ngrams->prob + lVar3) =
             *(undefined4 *)
              ((long)__ptr + (long)(int)*(float *)((long)&raw_ngrams->prob + lVar3) * 4);
      }
      else {
        *(undefined4 *)((long)&raw_ngrams->backoff + lVar3) =
             *(undefined4 *)
              ((long)__ptr + (long)(int)*(float *)((long)&raw_ngrams->backoff + lVar3) * 4);
      }
      lVar3 = lVar3 + 0x18;
    } while ((ulong)(uint)counts * 0x18 != lVar3);
  }
  ckd_free(__ptr);
  return;
}

Assistant:

static void
read_dmp_weight_array(FILE * fp, logmath_t * lmath, uint8 do_swap,
                      int32 counts, ngram_raw_t * raw_ngrams,
                      int weight_idx)
{
    int32 i, k;
    dmp_weight_t *tmp_weight_arr;

    fread(&k, sizeof(k), 1, fp);
    if (do_swap)
        SWAP_INT32(&k);
    tmp_weight_arr =
        (dmp_weight_t *) ckd_calloc(k, sizeof(*tmp_weight_arr));
    fread(tmp_weight_arr, sizeof(*tmp_weight_arr), k, fp);
    for (i = 0; i < k; i++) {
        if (do_swap)
            SWAP_INT32(&tmp_weight_arr[i].l);
        /* Convert values to log. */
        tmp_weight_arr[i].f =
            logmath_log10_to_log_float(lmath, tmp_weight_arr[i].f);
    }
    /* replace indexes with real probs in raw bigrams */
    for (i = 0; i < counts; i++) {
	if (weight_idx == 0) {
	    raw_ngrams[i].prob =
                tmp_weight_arr[(int) raw_ngrams[i].prob].f;
        } else {
	    raw_ngrams[i].backoff =
                tmp_weight_arr[(int) raw_ngrams[i].backoff].f;
        }
    }
    ckd_free(tmp_weight_arr);
}